

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metric_test.cc
# Opt level: O1

void __thiscall xLearn::MAEMetricTest_mae_test_Test::TestBody(MAEMetricTest_mae_test_Test *this)

{
  bool bVar1;
  uint uVar2;
  ThreadPool *this_00;
  char *pcVar3;
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar4 [16];
  undefined1 extraout_var [56];
  undefined1 in_XMM2 [16];
  AssertionResult gtest_ar_2;
  vector<float,_std::allocator<float>_> pred;
  vector<float,_std::allocator<float>_> Y;
  MAEMetric metric;
  AssertionResult gtest_ar;
  AssertHelper local_a0;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_98;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  vector<float,_std::allocator<float>_> local_88;
  vector<float,_std::allocator<float>_> local_68;
  MAEMetric local_50;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  undefined1 auVar5 [64];
  
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_50.super_Metric._vptr_Metric._0_4_ = 0x41400000;
  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
            (&local_68,(iterator)0x0,(float *)&local_50);
  local_50.super_Metric._vptr_Metric._0_4_ = 0x41500000;
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_68,
               (iterator)
               local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 13.0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric._0_4_ = 0x41600000;
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_68,
               (iterator)
               local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 14.0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric._0_4_ = 0x41700000;
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_68,
               (iterator)
               local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 15.0;
    local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_finish = (float *)0x0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (float *)0x0;
  local_50.super_Metric._vptr_Metric._0_4_ = 0x41300000;
  std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
            (&local_88,(iterator)0x0,(float *)&local_50);
  local_50.super_Metric._vptr_Metric._0_4_ = 0x41400000;
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 12.0;
    local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric._0_4_ = 0x41500000;
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 13.0;
    local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric =
       (_func_int **)CONCAT44(local_50.super_Metric._vptr_Metric._4_4_,0x41600000);
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish ==
      local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<float,_std::allocator<float>_>::_M_realloc_insert<float>
              (&local_88,
               (iterator)
               local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_finish,(float *)&local_50);
  }
  else {
    *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
     _M_finish = 14.0;
    local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
    _M_finish = local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                super__Vector_impl_data._M_finish + 1;
  }
  local_50.super_Metric._vptr_Metric = (_func_int **)&PTR__Metric_0016f1a8;
  local_50.error_ = 0.0;
  local_50.total_example_ = 0;
  uVar2 = std::thread::hardware_concurrency();
  auVar5._8_56_ = extraout_var;
  auVar5._0_8_ = extraout_XMM1_Qa;
  auVar4 = auVar5._0_16_;
  this_00 = (ThreadPool *)operator_new(0x120);
  ThreadPool::ThreadPool(this_00,(ulong)uVar2);
  local_50.super_Metric.threadNumber_ =
       (long)(this_00->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_finish -
       (long)(this_00->workers).super__Vector_base<std::thread,_std::allocator<std::thread>_>.
             _M_impl.super__Vector_impl_data._M_start >> 3;
  local_50.super_Metric.pool_ = this_00;
  MAEMetric::Accumulate(&local_50,&local_68,&local_88);
  auVar4 = vcvtusi2ss_avx512f(auVar4,local_50.total_example_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&local_30,"metric_val","1.0",local_50.error_ / auVar4._0_4_,1.0);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_98);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,199,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_50.error_ = 0.0;
  local_50.total_example_ = 0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[0] = 23.0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 24.0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 25.0;
  local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = 26.0;
  *local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
   _M_start = 12.0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[1] = 12.0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[2] = 12.0;
  local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_start[3] = 12.0;
  MAEMetric::Accumulate(&local_50,&local_68,&local_88);
  auVar4 = vcvtusi2ss_avx512f(in_XMM2,local_50.total_example_);
  testing::internal::CmpHelperFloatingPointEQ<float>
            ((internal *)&local_30,"metric_val","12.5",local_50.error_ / auVar4._0_4_,12.5);
  if ((char)local_30._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_98);
    if ((undefined8 *)local_30._M_string_length == (undefined8 *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = *(char **)local_30._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xd3,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_98);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_98.ptr_ !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         (local_98.ptr_ !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(long *)local_98.ptr_ + 8))();
      }
      local_98.ptr_ = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
      ;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_30._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_30.field_2._M_allocated_capacity._0_4_ = 0x45414d;
  local_30._M_string_length = 3;
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  testing::internal::CmpHelperEQ<std::__cxx11::string,char[4]>
            ((internal *)&local_98,"metric.metric_type()","\"MAE\"",&local_30,(char (*) [4])"MAE");
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  if (local_98.ptr_._0_1_ == (internal)0x0) {
    testing::Message::Message((Message *)&local_30);
    if (local_90.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_90.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/etveritas[P]xlearn/src/loss/metric_test.cc"
               ,0xd4,pcVar3);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_30);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_30._M_dataplus._M_p + 8))();
      }
      local_30._M_dataplus._M_p = (pointer)0x0;
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_90,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_88.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_68.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(RecallMetricTest, recall_test) {
  std::vector<real_t> Y;
  Y.push_back(1.0);
  Y.push_back(1.0);
  Y.push_back(-1.0);
  Y.push_back(-1.0);
  std::vector<real_t> pred;
  pred.push_back(100);
  pred.push_back(32);
  pred.push_back(12);
  pred.push_back(-21);
  RecallMetric metric;
  size_t threadNumber = std::thread::hardware_concurrency();
  ThreadPool* pool = new ThreadPool(threadNumber);
  metric.Initialize(pool);
  metric.Accumulate(Y, pred);
  real_t metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (2.0 / 2.0));
  metric.Reset();
  Y[0] = 1.0;
  Y[1] = -1.0;
  Y[2] = 1.0;
  Y[3] = -1.0;
  pred[0] = 12;
  pred[1] = 12;
  pred[2] = -12;
  pred[3] = -12;
  metric.Accumulate(Y, pred);
  metric_val = metric.GetMetric();
  EXPECT_FLOAT_EQ(metric_val, (1.0 / 2.0));
  EXPECT_EQ(metric.metric_type(), "Recall");
}